

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tester.h
# Opt level: O2

void __thiscall
density_tests::
QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>
::add_test_case(QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>
                *this,runtime_type *i_type,PutTestCase i_put_func,
               ReentrantPutTestCase i_reentrant_put_func,ConsumeTestCase i_consume_func,
               ReentrantConsumeTestCase i_reentrant_consume_func)

{
  pair<std::__detail::_Node_iterator<std::pair<const_density::runtime_type<>,_unsigned_long>,_false,_false>,_bool>
  pVar1;
  ReentrantConsumeTestCase i_reentrant_consume_func_local;
  ConsumeTestCase i_consume_func_local;
  ReentrantPutTestCase i_reentrant_put_func_local;
  PutTestCase i_put_func_local;
  tuple_type *local_20;
  long local_18;
  
  local_18 = *(long *)(this + 0x48) - *(long *)(this + 0x40) >> 3;
  local_20 = i_type->m_feature_table;
  i_reentrant_consume_func_local = i_reentrant_consume_func;
  i_consume_func_local = i_consume_func;
  i_reentrant_put_func_local = i_reentrant_put_func;
  i_put_func_local = i_put_func;
  pVar1 = std::
          _Hashtable<density::runtime_type<>,std::pair<density::runtime_type<>const,unsigned_long>,std::allocator<std::pair<density::runtime_type<>const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<density::runtime_type<>>,std::hash<density::runtime_type<>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<std::pair<density::runtime_type<>,unsigned_long>>
                    ((_Hashtable<density::runtime_type<>,std::pair<density::runtime_type<>const,unsigned_long>,std::allocator<std::pair<density::runtime_type<>const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<density::runtime_type<>>,std::hash<density::runtime_type<>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)(this + 8));
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    detail::assert_failed<>
              ("result.second",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/../../test_framework/queue_generic_tester.h"
               ,0x48);
  }
  std::
  vector<bool_(*)(density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_&,_density_tests::EasyRandom_&),_std::allocator<bool_(*)(density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_&,_density_tests::EasyRandom_&)>_>
  ::push_back((vector<bool_(*)(density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_&,_density_tests::EasyRandom_&),_std::allocator<bool_(*)(density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_&,_density_tests::EasyRandom_&)>_>
               *)(this + 0x40),&i_put_func_local);
  std::
  vector<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>::reentrant_put_transaction<void>_(*)(density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_&,_density_tests::EasyRandom_&),_std::allocator<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>::reentrant_put_transaction<void>_(*)(density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_&,_density_tests::EasyRandom_&)>_>
  ::push_back((vector<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>::reentrant_put_transaction<void>_(*)(density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_&,_density_tests::EasyRandom_&),_std::allocator<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>::reentrant_put_transaction<void>_(*)(density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_&,_density_tests::EasyRandom_&)>_>
               *)(this + 0x70),&i_reentrant_put_func_local);
  std::
  vector<void_(*)(const_density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>::consume_operation_&),_std::allocator<void_(*)(const_density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>::consume_operation_&)>_>
  ::push_back((vector<void_(*)(const_density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>::consume_operation_&),_std::allocator<void_(*)(const_density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>::consume_operation_&)>_>
               *)(this + 0x58),&i_consume_func_local);
  std::
  vector<void_(*)(const_density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>::reentrant_consume_operation_&),_std::allocator<void_(*)(const_density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>::reentrant_consume_operation_&)>_>
  ::push_back((vector<void_(*)(const_density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>::reentrant_consume_operation_&),_std::allocator<void_(*)(const_density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>::reentrant_consume_operation_&)>_>
               *)(this + 0x88),&i_reentrant_consume_func_local);
  return;
}

Assistant:

void add_test_case(
          const typename QUEUE::runtime_type & i_type,
          PutTestCase                          i_put_func,
          ReentrantPutTestCase                 i_reentrant_put_func,
          ConsumeTestCase                      i_consume_func,
          ReentrantConsumeTestCase             i_reentrant_consume_func)
        {
            auto result = m_element_types.insert(std::make_pair(i_type, m_put_cases.size()));
            DENSITY_TEST_ASSERT(result.second);

            m_put_cases.push_back(i_put_func);
            m_reentrant_put_cases.push_back(i_reentrant_put_func);
            m_consume_cases.push_back(i_consume_func);
            m_reentrant_consume_cases.push_back(i_reentrant_consume_func);
        }